

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QObject_*>::growAppend
          (QCommonArrayOps<QObject_*> *this,QObject **b,QObject **e)

{
  long lVar1;
  bool bVar2;
  QArrayDataPointer<QObject_*> *old_00;
  QObject **in_RDX;
  QObject **in_RSI;
  QPodArrayOps<QObject_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<QObject_*> *c;
  GrowthPosition where;
  QArrayDataPointer<QObject_*> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    old_00 = (QArrayDataPointer<QObject_*> *)((long)in_RDX - (long)in_RSI >> 3);
    c = (QCommonArrayOps<QObject_*> *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QArrayDataPointer<QObject_*> *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QObject_*>::QArrayDataPointer
              ((QArrayDataPointer<QObject_*> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<QObject*>,QObject*const*>
                      ((QObject ***)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<QObject_*>::detachAndGrow
                (this_00,where,(qsizetype)in_RDI,(QObject ***)in_RDX,old_00);
    }
    else {
      QArrayDataPointer<QObject_*>::detachAndGrow
                (this_00,where,(qsizetype)in_RDI,(QObject ***)in_RDX,old_00);
    }
    QPodArrayOps<QObject_*>::copyAppend(in_RDI,in_RDX,(QObject **)old_00);
    QArrayDataPointer<QObject_*>::~QArrayDataPointer(old_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }